

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_device_memory_device.cpp
# Opt level: O2

void embree::renderPixelStandard
               (TutorialData *data,int x,int y,int *pixels,uint width,uint height,float time,
               ISPCCamera *camera,RayStats *stats)

{
  Vec3fa *pVVar1;
  uint uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  float fVar7;
  float fVar8;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 local_138 [8];
  float fStack_130;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined8 local_118;
  float local_108;
  undefined8 local_104;
  uint local_f4;
  int iStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined8 local_d8;
  undefined1 local_d0 [16];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [16];
  undefined8 local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  undefined4 uStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined4 local_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  
  uVar3 = width * y + x;
  uVar2 = uVar3 * 0x2000 ^ uVar3;
  uVar2 = uVar2 >> 0x11 ^ uVar2;
  uVar2 = uVar2 << 5 ^ uVar2;
  uVar2 = uVar2 << 0xd ^ uVar2;
  uVar2 = uVar2 >> 0x11 ^ uVar2;
  uVar2 = uVar2 << 5 ^ uVar2;
  uVar2 = uVar2 << 0xd ^ uVar2;
  uVar2 = uVar2 >> 0x11 ^ uVar2;
  fVar14 = (float)(uVar2 << 5 ^ uVar2) * 2.3283064e-10;
  auVar4._8_4_ = (float)x;
  auVar4._0_4_ = (float)y;
  local_128 = (camera->xfm).l.vz.field_0.field_0.x +
              auVar4._0_4_ * (camera->xfm).l.vy.field_0.field_0.x +
              auVar4._8_4_ * (camera->xfm).l.vx.field_0.field_0.x;
  fStack_124 = (camera->xfm).l.vz.field_0.field_0.y +
               auVar4._0_4_ * (camera->xfm).l.vy.field_0.field_0.y +
               auVar4._8_4_ * (camera->xfm).l.vx.field_0.field_0.y;
  auVar4._4_4_ = (camera->xfm).l.vz.field_0.field_0.z +
                 auVar4._0_4_ * (camera->xfm).l.vy.field_0.field_0.z +
                 auVar4._8_4_ * (camera->xfm).l.vx.field_0.field_0.z;
  auVar4._8_4_ = auVar4._0_4_ * 0.0 + auVar4._8_4_ * 0.0 + 0.0;
  auVar4._0_4_ = fStack_124 * fStack_124;
  fVar8 = auVar4._4_4_ * auVar4._4_4_;
  auVar4._8_4_ = auVar4._8_4_ * auVar4._8_4_;
  fVar9 = auVar4._0_4_ + local_128 * local_128 + fVar8;
  fVar12 = auVar4._0_4_ + auVar4._0_4_ + auVar4._8_4_;
  fVar8 = auVar4._0_4_ + fVar8 + fVar8;
  auVar4._8_4_ = auVar4._0_4_ + auVar4._8_4_ + auVar4._8_4_;
  auVar5._4_4_ = fVar12;
  auVar5._0_4_ = fVar9;
  auVar5._8_4_ = fVar8;
  auVar5._12_4_ = auVar4._8_4_;
  auVar6._4_4_ = fVar12;
  auVar6._0_4_ = fVar9;
  auVar6._8_4_ = fVar8;
  auVar6._12_4_ = auVar4._8_4_;
  auVar6 = rsqrtss(auVar5,auVar6);
  auVar4._8_4_ = auVar6._0_4_;
  fStack_120 = auVar4._8_4_ * auVar4._8_4_ * fVar9 * -0.5 * auVar4._8_4_ + auVar4._8_4_ * 1.5;
  fStack_130 = (float)(int)((ulong)*(undefined8 *)((long)&(camera->xfm).p.field_0 + 4) >> 0x20);
  local_138 = *(undefined8 *)&(camera->xfm).p.field_0;
  register0x0000120c = 0;
  local_128 = fStack_120 * local_128;
  fStack_124 = fStack_120 * fStack_124;
  fStack_120 = fStack_120 * auVar4._4_4_;
  local_118 = 0xffffffff7f800000;
  local_f4 = 0xffffffff;
  iStack_f0 = -1;
  uStack_ec = 0xffffffff;
  uStack_e8 = 0xffffffff;
  local_b8 = 0x300000000;
  local_b0 = (undefined1  [16])0x0;
  local_a0 = 0;
  fStack_11c = fVar14;
  rtcTraversableIntersect1(data->g_traversable,local_138);
  auVar4._0_4_ = 0.0;
  auVar4._4_4_ = 0.0;
  auVar4._8_4_ = 0.0;
  stats->numRays = stats->numRays + 1;
  if (iStack_f0 != -1) {
    pVVar1 = data->face_colors + local_f4;
    fVar8 = (pVVar1->field_0).m128[0];
    fVar9 = (pVVar1->field_0).m128[1];
    fVar12 = (pVVar1->field_0).m128[2];
    local_d0._0_12_ = ZEXT812(0);
    local_d0._12_4_ = 0;
    auVar4._0_4_ = fVar8 * 0.5 + 0.0;
    auVar4._4_4_ = fVar9 * 0.5 + 0.0;
    auVar4._8_4_ = fVar12 * 0.5 + 0.0;
    auVar4._12_4_ = (pVVar1->field_0).m128[3] * 0.5 + 0.0;
    auVar6 = rsqrtss(auVar4,0x40400000);
    fVar10 = auVar6._0_4_;
    fVar10 = fVar10 * 1.5 - fVar10 * fVar10 * fVar10 * 1.5;
    local_98 = (float)local_118 * local_128 + (float)local_138._0_4_;
    fStack_94 = (float)local_118 * fStack_124 + (float)local_138._4_4_;
    fStack_90 = (float)local_118 * fStack_120 + fStack_130;
    local_88 = -(fVar10 * -1.0);
    fStack_84 = -(fVar10 * -1.0);
    fStack_80 = -(fVar10 * -1.0);
    fStack_7c = 1.0 - fVar14;
    uStack_8c = 0x3a83126f;
    local_78 = 0xffffffff7f800000;
    local_54 = 0xffffffff;
    uStack_50 = 0xffffffff;
    uStack_4c = 0xffffffff;
    uStack_48 = 0xffffffff;
    local_d8 = 0x300000000;
    local_c0 = 0;
    rtcTraversableOccluded1(data->g_traversable,&local_98);
    stats->numRays = stats->numRays + 1;
    if (0.0 <= (float)local_78) {
      fVar14 = (float)local_104;
      fVar7 = (float)((ulong)local_104 >> 0x20);
      fVar11 = local_108 * local_108 + fVar14 * fVar14 + fVar7 * fVar7;
      auVar6 = rsqrtss(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11));
      fVar13 = auVar6._0_4_;
      fVar11 = fVar13 * fVar13 * fVar11 * -0.5 * fVar13 + fVar13 * 1.5;
      fVar14 = -(fVar10 * -1.0 * fVar11 * fVar7 +
                fVar10 * -1.0 * fVar11 * fVar14 + fVar10 * -1.0 * local_108 * fVar11);
      if (1.0 <= fVar14) {
        fVar14 = 1.0;
      }
      fVar10 = 0.0;
      if (0.0 <= fVar14) {
        fVar10 = fVar14;
      }
      auVar4._0_4_ = auVar4._0_4_ + fVar8 * fVar10;
      auVar4._4_4_ = auVar4._4_4_ + fVar9 * fVar10;
      auVar4._8_4_ = auVar4._8_4_ + fVar12 * fVar10;
    }
  }
  if (1.0 <= auVar4._0_4_) {
    auVar4._0_4_ = 1.0;
  }
  fVar8 = 0.0;
  if (0.0 <= auVar4._0_4_) {
    fVar8 = auVar4._0_4_;
  }
  if (1.0 <= auVar4._4_4_) {
    auVar4._4_4_ = 1.0;
  }
  auVar4._0_4_ = 0.0;
  if (0.0 <= auVar4._4_4_) {
    auVar4._0_4_ = auVar4._4_4_;
  }
  if (1.0 <= auVar4._8_4_) {
    auVar4._8_4_ = 1.0;
  }
  auVar4._4_4_ = 0.0;
  if (0.0 <= auVar4._8_4_) {
    auVar4._4_4_ = auVar4._8_4_;
  }
  pixels[uVar3] =
       (int)(long)(auVar4._0_4_ * 255.0) * 0x100 + (int)(long)(fVar8 * 255.0) +
       (int)(long)(auVar4._4_4_ * 255.0) * 0x10000;
  return;
}

Assistant:

void renderPixelStandard(const TutorialData& data,
                         int x, int y, 
                         int* pixels,
                         const unsigned int width,
                         const unsigned int height,
                         const float time,
                         const ISPCCamera& camera, RayStats& stats)
{
  /* initialize ray */
  uint32_t state = doodle(x + y * width);
  state = doodle(state);
  float t = doodlef(state);
  Ray ray(Vec3fa(camera.xfm.p), Vec3fa(normalize(x*camera.xfm.l.vx + y*camera.xfm.l.vy + camera.xfm.l.vz)), 0.0f, inf, t);

  /* intersect ray with scene */
  RTCIntersectArguments iargs;
  rtcInitIntersectArguments(&iargs);
  iargs.feature_mask = (RTCFeatureFlags) (FEATURE_MASK);
  rtcTraversableIntersect1(data.g_traversable,RTCRayHit_(ray),&iargs);
  RayStats_addRay(stats);

  /* shade pixels */
  Vec3fa color = Vec3fa(0.0f);
  if (ray.geomID != RTC_INVALID_GEOMETRY_ID) // || ray.instID[0] != RTC_INVALID_GEOMETRY_ID)
  {
    Vec3fa diffuse = data.face_colors[ray.primID];
    color = color + diffuse*0.5f;
    Vec3fa lightDir = normalize(Vec3fa(-1,-1,-1));

    /* initialize shadow ray */
    Ray shadow(ray.org + ray.tfar*ray.dir, neg(lightDir), 0.001f, inf, 1.f - t);

    /* trace shadow ray */
    RTCOccludedArguments sargs;
    rtcInitOccludedArguments(&sargs);
    sargs.feature_mask = (RTCFeatureFlags) (FEATURE_MASK);
    rtcTraversableOccluded1(data.g_traversable,RTCRay_(shadow),&sargs);
    RayStats_addShadowRay(stats);

    /* add light contribution */
    if (shadow.tfar >= 0.0f)
      color = color + diffuse*clamp(-dot(lightDir,normalize(ray.Ng)),0.0f,1.0f);
  }

  /* write color to framebuffer */
  unsigned int r = (unsigned int) (255.0f * clamp(color.x,0.0f,1.0f));
  unsigned int g = (unsigned int) (255.0f * clamp(color.y,0.0f,1.0f));
  unsigned int b = (unsigned int) (255.0f * clamp(color.z,0.0f,1.0f));
  pixels[y*width+x] = (b << 16) + (g << 8) + r;
}